

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_pcmpistrm_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  uint8_t uVar1;
  undefined2 uVar2;
  int valids;
  int validd;
  uint local_2c;
  int local_28;
  uint res;
  int i;
  uint32_t ctrl_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  uVar1 = (uint8_t)ctrl;
  valids = pcmp_ilen(s,uVar1);
  validd = pcmp_ilen(d,uVar1);
  local_2c = pcmpxstrx(env,d,s,uVar1,valids,validd);
  if ((ctrl >> 6 & 1) == 0) {
    env->xmm_regs[0]._q_ZMMReg[1] = 0;
    *(ulong *)env->xmm_regs = (ulong)local_2c;
  }
  else if ((ctrl & 1) == 0) {
    for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
      uVar1 = '\0';
      if ((local_2c & 1) != 0) {
        uVar1 = 0xff;
      }
      env->xmm_regs[0]._b_ZMMReg[local_28] = uVar1;
      local_2c = local_2c >> 1;
    }
  }
  else {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      uVar2 = 0;
      if ((local_2c & 1) != 0) {
        uVar2 = 0xffff;
      }
      *(undefined2 *)((long)env->xmm_regs + (long)local_28 * 2) = uVar2;
      local_2c = local_2c >> 1;
    }
  }
  return;
}

Assistant:

void glue(helper_pcmpistrm, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    int i;
    unsigned int res = pcmpxstrx(env, d, s, ctrl,
                                 pcmp_ilen(s, ctrl),
                                 pcmp_ilen(d, ctrl));

    if ((ctrl >> 6) & 1) {
        if (ctrl & 1) {
            for (i = 0; i < 8; i++, res >>= 1) {
                env->xmm_regs[0].W(i) = (res & 1) ? ~0 : 0;
            }
        } else {
            for (i = 0; i < 16; i++, res >>= 1) {
                env->xmm_regs[0].B(i) = (res & 1) ? ~0 : 0;
            }
        }
    } else {
        env->xmm_regs[0].Q(1) = 0;
        env->xmm_regs[0].Q(0) = res;
    }
}